

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.c
# Opt level: O1

Map * Map_Push_And_Get(Map *tree,void *str,size_t size,void *id)

{
  size_t sVar1;
  size_t sVar2;
  Map *pMVar3;
  
  sVar1 = 0;
  sVar2 = sVar1;
  if (size != 0) {
    do {
      pMVar3 = tree->delta[*(byte *)((long)str + sVar1)];
      sVar2 = sVar1;
      if (pMVar3 == (Map *)0x0) break;
      sVar1 = sVar1 + 1;
      sVar2 = size;
      tree = pMVar3;
    } while (size != sVar1);
  }
  if (sVar2 == size) {
    if (tree->ID == (void *)0x0) goto LAB_00143c31;
  }
  else {
    pMVar3 = tree;
    if (sVar2 < size) {
      do {
        tree = (Map *)malloc(0x810);
        pMVar3->delta[*(byte *)((long)str + sVar2)] = tree;
        tree->is_final = '\0';
        sVar2 = sVar2 + 1;
        memset(tree->delta,0,0x808);
        pMVar3 = tree;
      } while (size != sVar2);
    }
  }
  tree->ID = id;
LAB_00143c31:
  tree->is_final = '\x01';
  return tree;
}

Assistant:

struct Map* Map_Push_And_Get(struct Map* tree,void *str,size_t size,void *id)
{
	size_t temp;
	Map_Scour(tree,str,size,&temp,&tree);	

	if(temp == size)
	{
		if(tree->ID!=NULL)tree->ID=id;
		tree->is_final=1;
		return tree;
	}

	for(temp;temp<size;++temp)
	{
		Map_Init(
			tree=
			tree->delta[((unsigned char*)str)[temp]]=
			malloc(sizeof(Map))
			);
	}

	tree->ID=id;
	tree->is_final=1;
	return tree;
}